

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void BrotliStoreUncompressedMetaBlock
               (int is_final_block,uint8_t *input,size_t position,size_t mask,size_t len,
               size_t *storage_ix,uint8_t *storage)

{
  uint8_t *puVar1;
  uint uVar2;
  ulong uVar3;
  size_t __n;
  ulong uVar4;
  ulong uVar5;
  size_t nlenbits;
  uint64_t lenbits;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar4 = *storage_ix;
  *(ulong *)(storage + (uVar4 >> 3)) = (ulong)storage[uVar4 >> 3];
  uVar5 = uVar4 + 1;
  *storage_ix = uVar5;
  BrotliEncodeMlen(len,&local_40,&local_48,&local_38);
  if (local_38 < 4) {
    *(ulong *)(storage + (uVar5 >> 3)) = local_38 << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
    uVar4 = uVar4 + 3;
    *storage_ix = uVar4;
    if (local_40 >> ((byte)local_48 & 0x3f) == 0) {
      if (0x38 < local_48) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      uVar3 = position & mask;
      *(ulong *)(storage + (uVar4 >> 3)) =
           local_40 << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      uVar5 = local_48 + uVar4;
      *storage_ix = uVar5;
      *(ulong *)(storage + (uVar5 >> 3)) = (ulong)storage[uVar5 >> 3] | 1L << ((byte)uVar5 & 7);
      *storage_ix = local_48 + uVar4 + 1;
      uVar2 = (int)uVar5 + 8;
      uVar5 = (ulong)(uVar2 & 0xfffffff8);
      *storage_ix = uVar5;
      uVar2 = uVar2 >> 3;
      storage[uVar2] = '\0';
      if (mask + 1 < uVar3 + len) {
        __n = (mask + 1) - uVar3;
        memcpy(storage + uVar2,input + uVar3,__n);
        *storage_ix = uVar5 + __n * 8;
        len = len - __n;
        uVar3 = 0;
      }
      uVar4 = *storage_ix;
      memcpy(storage + (uVar4 >> 3),input + uVar3,len);
      uVar5 = uVar4 + len * 8;
      *storage_ix = uVar5;
      if ((uVar4 & 7) != 0) {
        __assert_fail("(pos & 7) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x52,"void BrotliWriteBitsPrepareStorage(size_t, uint8_t *)");
      }
      uVar4 = uVar5 >> 3;
      storage[uVar4] = '\0';
      if (is_final_block != 0) {
        puVar1 = storage + uVar4;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        *storage_ix = uVar5 | 1;
        *(ulong *)(storage + uVar4) = (ulong)storage[uVar4] | 2;
        uVar2 = (int)uVar5 + 9;
        *storage_ix = (ulong)(uVar2 & 0xfffffff8);
        storage[uVar2 >> 3] = '\0';
      }
      return;
    }
  }
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                ,0x36,"void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
  ;
}

Assistant:

void BrotliStoreUncompressedMetaBlock(BROTLI_BOOL is_final_block,
                                      const uint8_t * BROTLI_RESTRICT input,
                                      size_t position, size_t mask,
                                      size_t len,
                                      size_t * BROTLI_RESTRICT storage_ix,
                                      uint8_t * BROTLI_RESTRICT storage) {
  size_t masked_pos = position & mask;
  BrotliStoreUncompressedMetaBlockHeader(len, storage_ix, storage);
  JumpToByteBoundary(storage_ix, storage);

  if (masked_pos + len > mask + 1) {
    size_t len1 = mask + 1 - masked_pos;
    memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len1);
    *storage_ix += len1 << 3;
    len -= len1;
    masked_pos = 0;
  }
  memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len);
  *storage_ix += len << 3;

  /* We need to clear the next 4 bytes to continue to be
     compatible with BrotliWriteBits. */
  BrotliWriteBitsPrepareStorage(*storage_ix, storage);

  /* Since the uncompressed block itself may not be the final block, add an
     empty one after this. */
  if (is_final_block) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    JumpToByteBoundary(storage_ix, storage);
  }
}